

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBox::setButtonText(QMessageBox *this,int button,QString *text)

{
  long lVar1;
  bool bVar2;
  QMessageBoxPrivate *this_00;
  QAbstractButton *this_01;
  QMessageBoxPrivate *in_RDX;
  int in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QAbstractButton *abstractButton;
  QMessageBoxPrivate *d;
  bool local_52;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QMessageBox *)0x7a84e3);
  this_01 = QMessageBoxPrivate::abstractButtonForId(in_RDX,(int)((ulong)this_00 >> 0x20));
  if (this_01 == (QAbstractButton *)0x0) {
    QDialogButtonBox::buttons((QDialogButtonBox *)0x0);
    bVar2 = QList<QAbstractButton_*>::isEmpty((QList<QAbstractButton_*> *)0x7a8537);
    local_52 = false;
    if (bVar2) {
      local_52 = in_ESI == 0x400 || in_ESI == 1;
    }
    QList<QAbstractButton_*>::~QList((QList<QAbstractButton_*> *)0x7a857c);
    if (local_52) {
      addButton((QMessageBox *)this_00,(StandardButton)((ulong)this_01 >> 0x20));
      QAbstractButton::setText(this_01,in_RDI);
    }
  }
  else {
    QAbstractButton::setText(this_01,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::setButtonText(int button, const QString &text)
{
    Q_D(QMessageBox);
    if (QAbstractButton *abstractButton = d->abstractButtonForId(button)) {
        abstractButton->setText(text);
    } else if (d->buttonBox->buttons().isEmpty() && (button == Ok || button == Old_Ok)) {
        // for compatibility with Qt 4.0/4.1
        addButton(QMessageBox::Ok)->setText(text);
    }
}